

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

ssize_t __thiscall CharConvLatin1::read(CharConvLatin1 *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  
  uVar1 = (**(code **)(*__buf + 0x10))(__buf,__fd,(long)(int)__nbytes);
  if ((int)uVar1 == 0) {
    if (0 < (int)__nbytes) {
      uVar1 = (__nbytes & 0xffffffff) + 1;
      do {
        *(uint *)(CONCAT44(in_register_00000034,__fd) + -8 + uVar1 * 4) =
             (uint)*(byte *)(CONCAT44(in_register_00000034,__fd) + -2 + uVar1);
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
    return uVar1;
  }
  err_throw(0x65);
}

Assistant:

virtual void read(wchar_t *buf, CVmDataSource *src, int cnt)
    {
        /* read the latin-1 character bytes into the buffer */
        if (src->read(buf, cnt))
            err_throw(VMERR_READ_FILE);

        /* 
         *   The file characters are bytes, but we want wide characters.  The
         *   bytewise read packed the Latin-1 byte representations into the
         *   lower half of the buffer.  Run through the buffer from the end,
         *   expanding each byte into a wide character.  This is trivial for
         *   Latin-1 since a Latin-1 code point is identical to the
         *   corresponding Unicode code point.  
         */
        for (int i = cnt - 1 ; i >= 0 ; --i)
            buf[i] = (wchar_t)(((unsigned char *)buf)[i]);
    }